

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::Q3BSPFileImporter::expandFile
          (Q3BSPFileImporter *this,ZipArchiveIOSystem *pArchive,string *rFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rExtList,string *rFile,string *rExt)

{
  int iVar1;
  bool bVar2;
  pointer __rhs;
  string textureName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (pArchive == (ZipArchiveIOSystem *)0x0) {
    __assert_fail("__null != pArchive",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x2a4,
                  "bool Assimp::Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *, const std::string &, const std::vector<std::string> &, std::string &, std::string &)"
                 );
  }
  if (rFilename->_M_string_length != 0) {
    __rhs = (rExtList->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    if (__rhs == (rExtList->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)rFile);
      std::__cxx11::string::assign((char *)rExt);
      bVar2 = true;
    }
    else {
      bVar2 = false;
      do {
        if (__rhs == (rExtList->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
          return bVar2;
        }
        std::operator+(&local_50,rFilename,__rhs);
        iVar1 = (*(pArchive->super_IOSystem)._vptr_IOSystem[2])(pArchive,local_50._M_dataplus._M_p);
        if ((char)iVar1 != '\0') {
          std::__cxx11::string::_M_assign((string *)rExt);
          bVar2 = true;
          std::__cxx11::string::_M_assign((string *)rFile);
        }
        std::__cxx11::string::~string((string *)&local_50);
        __rhs = __rhs + 1;
      } while ((char)iVar1 == '\0');
    }
    return bVar2;
  }
  __assert_fail("!rFilename.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                ,0x2a5,
                "bool Assimp::Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *, const std::string &, const std::vector<std::string> &, std::string &, std::string &)"
               );
}

Assistant:

bool Q3BSPFileImporter::expandFile(ZipArchiveIOSystem *pArchive, const std::string &rFilename,
                                   const std::vector<std::string> &rExtList, std::string &rFile,
                                   std::string &rExt )
{
    ai_assert( NULL != pArchive );
    ai_assert( !rFilename.empty() );

    if ( rExtList.empty() )
    {
        rFile =  rFilename;
        rExt = "";
        return true;
    }

    bool found = false;
    for ( std::vector<std::string>::const_iterator it = rExtList.begin(); it != rExtList.end(); ++it )
    {
        const std::string textureName = rFilename + *it;
        if ( pArchive->Exists( textureName.c_str() ) )
        {
            rExt = *it;
            rFile = textureName;
            found = true;
            break;
        }
    }

    return found;
}